

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                 int flags)

{
  undefined1 uVar1;
  U32 UVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  undefined4 *puVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  char cVar12;
  uint uVar13;
  long *plVar14;
  int iVar15;
  BYTE *huffWeight;
  ulong uVar16;
  size_t sVar17;
  undefined1 uVar18;
  uint uVar19;
  uint uVar20;
  U32 tableLog;
  U32 nbSymbols;
  long local_78;
  ulong local_70;
  size_t local_68;
  ulong local_60;
  long local_58;
  long local_50;
  HUF_DTable *local_48;
  HUF_DTable *local_40;
  HUF_DTable *local_38;
  
  tableLog = 0;
  nbSymbols = 0;
  sVar17 = 0xffffffffffffffd4;
  if (0x5d3 < wkspSize) {
    huffWeight = (BYTE *)((long)workSpace + 0x4d4);
    local_68 = HUF_readStats_wksp(huffWeight,0x100,(U32 *)workSpace,&nbSymbols,&tableLog,src,srcSize
                                  ,(void *)((long)workSpace + 0x68),0x36c,flags);
    UVar2 = nbSymbols;
    sVar17 = local_68;
    if (local_68 < 0xffffffffffffff89) {
      local_60._0_4_ = *DTable;
      uVar19 = ((uint)local_60 & 0xff) + 1;
      local_70 = 0xb;
      if (uVar19 < 0xb) {
        local_70 = (ulong)uVar19;
      }
      uVar4 = (ulong)nbSymbols;
      uVar13 = (uint)local_70;
      if (tableLog < uVar13 || tableLog - uVar13 == 0) {
        if (tableLog < uVar13) {
          uVar20 = uVar13 - tableLog;
          if (uVar4 != 0) {
            uVar3 = 0;
            do {
              cVar12 = '\0';
              if (huffWeight[uVar3] != '\0') {
                cVar12 = (char)uVar20;
              }
              huffWeight[uVar3] = cVar12 + huffWeight[uVar3];
              uVar3 = uVar3 + 1;
            } while (uVar4 != uVar3);
          }
          if (uVar20 < uVar13) {
            puVar7 = (undefined4 *)((long)workSpace + local_70 * 4);
            uVar10 = uVar13;
            do {
              *puVar7 = *(undefined4 *)((long)workSpace + (ulong)((tableLog - uVar13) + uVar10) * 4)
              ;
              uVar10 = uVar10 - 1;
              puVar7 = puVar7 + -1;
            } while (uVar20 < uVar10);
          }
          if (uVar13 != tableLog) {
            memset((void *)((long)workSpace + ((ulong)uVar20 - (ulong)(~tableLog + uVar13)) * 4),0,
                   (ulong)(~tableLog + uVar13) * 4 + 4);
          }
        }
      }
      else {
        local_70 = (ulong)tableLog;
      }
      tableLog = (U32)local_70;
      sVar17 = 0xffffffffffffffd4;
      if (tableLog <= uVar19) {
        *(char *)DTable = (char)(uint)local_60;
        *(undefined1 *)((long)DTable + 1) = 0;
        *(char *)((long)DTable + 2) = (char)local_70;
        *(char *)((long)DTable + 3) = (char)((uint)local_60 >> 0x18);
        if (-1 < (int)tableLog) {
          uVar3 = 0;
          iVar5 = 0;
          do {
            iVar15 = *(int *)((long)workSpace + uVar3 * 4);
            *(int *)((long)workSpace + uVar3 * 4 + 0x34) = iVar5;
            uVar3 = uVar3 + 1;
            iVar5 = iVar15 + iVar5;
          } while (tableLog + 1 != uVar3);
        }
        uVar3 = 0;
        if (3 < (int)UVar2) {
          uVar3 = 0;
          do {
            uVar16 = uVar3 & 0xffffffff;
            lVar8 = 0;
            do {
              uVar19 = *(uint *)((long)workSpace + (ulong)huffWeight[lVar8] * 4 + 0x34);
              *(uint *)((long)workSpace + (ulong)huffWeight[lVar8] * 4 + 0x34) = uVar19 + 1;
              *(char *)((long)workSpace + (ulong)uVar19 + 0x3d4) = (char)uVar16;
              lVar8 = lVar8 + 1;
              uVar16 = (ulong)(byte)((char)uVar16 + 1);
            } while (lVar8 != 4);
            uVar3 = uVar3 + 4;
            huffWeight = huffWeight + 4;
          } while ((long)uVar3 < (long)(int)UVar2 + -3);
        }
        if ((int)uVar3 < (int)UVar2) {
          uVar3 = uVar3 & 0xffffffff;
          do {
            uVar16 = (ulong)*(byte *)((long)workSpace + uVar3 + 0x4d4);
            uVar19 = *(uint *)((long)workSpace + uVar16 * 4 + 0x34);
            *(uint *)((long)workSpace + uVar16 * 4 + 0x34) = uVar19 + 1;
            *(char *)((long)workSpace + (ulong)uVar19 + 0x3d4) = (char)uVar3;
            uVar3 = uVar3 + 1;
          } while (uVar4 != uVar3);
        }
        uVar19 = tableLog + 1;
        local_70 = (ulong)uVar19;
        sVar17 = local_68;
        if (1 < uVar19) {
          iVar5 = *workSpace;
          local_60 = (ulong)uVar19;
          local_40 = DTable + 3;
          local_78 = (long)workSpace + 0x3d4;
          local_48 = DTable + 1;
          local_50 = (long)DTable + 7;
          local_58 = (long)DTable + 5;
          local_38 = DTable + 7;
          iVar15 = 0;
          uVar4 = 1;
          do {
            uVar13 = *(uint *)((long)workSpace + uVar4 * 4);
            uVar3 = (ulong)uVar13;
            iVar11 = (1 << ((byte)uVar4 & 0x1f)) >> 1;
            uVar20 = uVar19 - (int)uVar4;
            uVar18 = (undefined1)uVar20;
            switch(iVar11) {
            case 1:
              if (0 < (int)uVar13) {
                lVar8 = local_58 + (long)iVar15 * 2;
                uVar16 = 0;
                do {
                  uVar1 = *(undefined1 *)(iVar5 + local_78 + uVar16);
                  *(undefined1 *)(lVar8 + -1 + uVar16 * 2) = uVar18;
                  *(undefined1 *)(lVar8 + uVar16 * 2) = uVar1;
                  uVar16 = uVar16 + 1;
                } while (uVar3 != uVar16);
              }
              break;
            case 2:
              if (0 < (int)uVar13) {
                lVar8 = local_50 + (long)iVar15 * 2;
                uVar16 = 0;
                do {
                  uVar1 = *(undefined1 *)(iVar5 + local_78 + uVar16);
                  *(undefined1 *)(lVar8 + -3 + uVar16 * 4) = uVar18;
                  *(undefined1 *)(lVar8 + -2 + uVar16 * 4) = uVar1;
                  *(undefined1 *)(lVar8 + -1 + uVar16 * 4) = uVar18;
                  *(undefined1 *)(lVar8 + uVar16 * 4) = uVar1;
                  uVar16 = uVar16 + 1;
                } while (uVar3 != uVar16);
              }
              break;
            default:
              if (0 < (int)uVar13) {
                lVar8 = (long)local_38 + (long)iVar15 * 2;
                uVar16 = 0;
                do {
                  if (iVar11 < 1) {
                    lVar6 = 0;
                  }
                  else {
                    lVar9 = ((ulong)*(byte *)((long)workSpace + (long)iVar5 + uVar16 + 0x3d4) << 8 |
                            (ulong)(uVar20 & 0xff)) * 0x1000100010001;
                    lVar6 = 0;
                    do {
                      *(long *)(lVar8 + -0x18 + lVar6 * 2) = lVar9;
                      *(long *)(lVar8 + -0x10 + lVar6 * 2) = lVar9;
                      *(long *)(lVar8 + -8 + lVar6 * 2) = lVar9;
                      *(long *)(lVar8 + lVar6 * 2) = lVar9;
                      lVar6 = lVar6 + 0x10;
                    } while (lVar6 < iVar11);
                  }
                  if ((int)lVar6 != iVar11) {
                    __assert_fail("u == length",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                                  ,0x1e1,
                                  "size_t HUF_readDTableX1_wksp(HUF_DTable *, const void *, size_t, void *, size_t, int)"
                                 );
                  }
                  uVar16 = uVar16 + 1;
                  lVar8 = lVar8 + (long)iVar11 * 2;
                } while (uVar16 != uVar3);
              }
              break;
            case 4:
              if (0 < (int)uVar13) {
                uVar16 = 0;
                do {
                  *(ulong *)((long)local_48 + uVar16 * 8 + (long)iVar15 * 2) =
                       ((ulong)*(byte *)(iVar5 + local_78 + uVar16) << 8 | (ulong)(uVar20 & 0xff)) *
                       0x1000100010001;
                  uVar16 = uVar16 + 1;
                } while (uVar3 != uVar16);
              }
              break;
            case 8:
              if (0 < (int)uVar13) {
                plVar14 = (long *)((long)local_40 + (long)iVar15 * 2);
                uVar16 = 0;
                do {
                  lVar8 = ((ulong)*(byte *)(iVar5 + local_78 + uVar16) << 8 | (ulong)(uVar20 & 0xff)
                          ) * 0x1000100010001;
                  plVar14[-1] = lVar8;
                  *plVar14 = lVar8;
                  uVar16 = uVar16 + 1;
                  plVar14 = plVar14 + 2;
                } while (uVar3 != uVar16);
              }
            }
            iVar5 = iVar5 + uVar13;
            iVar15 = iVar15 + iVar11 * uVar13;
            uVar4 = uVar4 + 1;
          } while (uVar4 != local_60);
        }
      }
    }
  }
  return sVar17;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize, int flags)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;
    HUF_ReadDTableX1_Workspace* wksp = (HUF_ReadDTableX1_Workspace*)workSpace;

    DEBUG_STATIC_ASSERT(HUF_DECOMPRESS_WORKSPACE_SIZE >= sizeof(*wksp));
    if (sizeof(*wksp) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* ZSTD_memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->huffWeight, HUF_SYMBOLVALUE_MAX + 1, wksp->rankVal, &nbSymbols, &tableLog, src, srcSize, wksp->statsWksp, sizeof(wksp->statsWksp), flags);
    if (HUF_isError(iSize)) return iSize;


    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        U32 const maxTableLog = dtd.maxTableLog + 1;
        U32 const targetTableLog = MIN(maxTableLog, HUF_DECODER_FAST_TABLELOG);
        tableLog = HUF_rescaleStats(wksp->huffWeight, wksp->rankVal, nbSymbols, tableLog, targetTableLog);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Compute symbols and rankStart given rankVal:
     *
     * rankVal already contains the number of values of each weight.
     *
     * symbols contains the symbols ordered by weight. First are the rankVal[0]
     * weight 0 symbols, followed by the rankVal[1] weight 1 symbols, and so on.
     * symbols[0] is filled (but unused) to avoid a branch.
     *
     * rankStart contains the offset where each rank belongs in the DTable.
     * rankStart[0] is not filled because there are no entries in the table for
     * weight 0.
     */
    {   int n;
        U32 nextRankStart = 0;
        int const unroll = 4;
        int const nLimit = (int)nbSymbols - unroll + 1;
        for (n=0; n<(int)tableLog+1; n++) {
            U32 const curr = nextRankStart;
            nextRankStart += wksp->rankVal[n];
            wksp->rankStart[n] = curr;
        }
        for (n=0; n < nLimit; n += unroll) {
            int u;
            for (u=0; u < unroll; ++u) {
                size_t const w = wksp->huffWeight[n+u];
                wksp->symbols[wksp->rankStart[w]++] = (BYTE)(n+u);
            }
        }
        for (; n < (int)nbSymbols; ++n) {
            size_t const w = wksp->huffWeight[n];
            wksp->symbols[wksp->rankStart[w]++] = (BYTE)n;
        }
    }

    /* fill DTable
     * We fill all entries of each weight in order.
     * That way length is a constant for each iteration of the outer loop.
     * We can switch based on the length to a different inner loop which is
     * optimized for that particular case.
     */
    {   U32 w;
        int symbol = wksp->rankVal[0];
        int rankStart = 0;
        for (w=1; w<tableLog+1; ++w) {
            int const symbolCount = wksp->rankVal[w];
            int const length = (1 << w) >> 1;
            int uStart = rankStart;
            BYTE const nbBits = (BYTE)(tableLog + 1 - w);
            int s;
            int u;
            switch (length) {
            case 1:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart] = D;
                    uStart += 1;
                }
                break;
            case 2:
                for (s=0; s<symbolCount; ++s) {
                    HUF_DEltX1 D;
                    D.byte = wksp->symbols[symbol + s];
                    D.nbBits = nbBits;
                    dt[uStart+0] = D;
                    dt[uStart+1] = D;
                    uStart += 2;
                }
                break;
            case 4:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    uStart += 4;
                }
                break;
            case 8:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    MEM_write64(dt + uStart, D4);
                    MEM_write64(dt + uStart + 4, D4);
                    uStart += 8;
                }
                break;
            default:
                for (s=0; s<symbolCount; ++s) {
                    U64 const D4 = HUF_DEltX1_set4(wksp->symbols[symbol + s], nbBits);
                    for (u=0; u < length; u += 16) {
                        MEM_write64(dt + uStart + u + 0, D4);
                        MEM_write64(dt + uStart + u + 4, D4);
                        MEM_write64(dt + uStart + u + 8, D4);
                        MEM_write64(dt + uStart + u + 12, D4);
                    }
                    assert(u == length);
                    uStart += length;
                }
                break;
            }
            symbol += symbolCount;
            rankStart += symbolCount * length;
        }
    }
    return iSize;
}